

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::OnDisConnect(RWSocket *this,uint16_t err)

{
  uint64_t *puVar1;
  element_type *this_00;
  int iVar2;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var3;
  uint *in_RCX;
  shared_ptr<cppnet::Buffer> *extraout_RDX;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  shared_ptr<cppnet::RWSocket> sock;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::RWSocket,void>
            ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::RWSocket>);
  p_Var3 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)Socket::__all_socket_map();
  puVar1 = &(this->super_Socket)._sock;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(p_Var3,puVar1);
  iVar2 = (*(this->super_Socket)._vptr_Socket[0x15])(this);
  if ((char)iVar2 == '\0') {
    std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&(this->super_Socket)._cppnet_base);
    this_00 = local_58._M_ptr;
    if ((_Any_data *)local_58._M_ptr != (_Any_data *)0x0) {
      std::__shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,&local_48);
      CppNetBase::OnDisConnect(this_00,(shared_ptr<cppnet::RWSocket> *)&local_38,err);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  (*(this->super_Socket)._vptr_Socket[0x14])(this);
  if ((err != 0) && (this->_event != (Event *)0x0)) {
    std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(this->super_Socket)._event_actions);
    if ((_Any_data *)local_58._M_ptr != (_Any_data *)0x0) {
      (**(code **)(*(long *)local_58._M_ptr + 0x48))
                ((_Any_data *)local_58._M_ptr,(shared_ptr<cppnet::CNSocket> *)this->_event,
                 extraout_RDX,in_RCX);
    }
    OsHandle::Close(*puVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

void RWSocket::OnDisConnect(uint16_t err) {
    auto sock = shared_from_this();
    __all_socket_map.erase(_sock);

    if (!IsShutdown()) {
        auto cppnet_base = _cppnet_base.lock();
        if (cppnet_base) {
            cppnet_base->OnDisConnect(sock, err);
        }
    }
    SetShutdown();

    // peer disconnect or connection break.
    if (_event && err != CEC_SUCCESS) {
        auto actions = GetEventActions();
        if (actions) {
            actions->DelEvent(_event);
        }
        OsHandle::Close(_sock);
    }
}